

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

uint ImGui::RoundScalarWithFormatT<unsigned_int,int>(char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  char cVar2;
  undefined4 in_register_00000014;
  char *src;
  double dVar3;
  char v_str [64];
  char fmt_sanitized [32];
  undefined4 local_7c;
  char local_78 [64];
  char local_38 [32];
  
  cVar2 = *format;
  while( true ) {
    if (cVar2 == '\0') {
      return v;
    }
    if ((cVar2 == '%') && (format[1] != '%')) break;
    format = format + (ulong)(cVar2 == '%') + 1;
    cVar2 = *format;
  }
  local_7c = v;
  SanitizeFormatString(format,local_38,CONCAT44(in_register_00000014,v));
  ImFormatString(local_78,0x40,local_38,(ulong)v);
  src = (char *)((long)&local_7c + 3);
  do {
    pcVar1 = src + 1;
    src = src + 1;
  } while (*pcVar1 == ' ');
  if ((data_type & 0xfffffffeU) == 8) {
    dVar3 = atof(src);
    local_7c = (uint)(long)dVar3;
  }
  else {
    ImAtoi<int>(src,&local_7c);
  }
  return local_7c;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}